

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

void __thiscall ncnn::Mat::create(Mat *this,int _w,int _h,size_t _elemsize,Allocator *_allocator)

{
  size_t sVar1;
  void *pvVar2;
  size_t in_RCX;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  Allocator *in_R8;
  size_t totalsize;
  
  if ((((in_RDI->dims != 2) || (in_RDI->w != in_ESI)) || (in_RDI->h != in_EDX)) ||
     (((in_RDI->elemsize != in_RCX || (in_RDI->elempack != 1)) || (in_RDI->allocator != in_R8)))) {
    release(in_RDI);
    in_RDI->elemsize = in_RCX;
    in_RDI->elempack = 1;
    in_RDI->allocator = in_R8;
    in_RDI->dims = 2;
    in_RDI->w = in_ESI;
    in_RDI->h = in_EDX;
    in_RDI->c = 1;
    in_RDI->cstep = (long)(in_RDI->w * in_RDI->h);
    sVar1 = total(in_RDI);
    if (sVar1 != 0) {
      sVar1 = total(in_RDI);
      sVar1 = ncnn::alignSize(sVar1 * in_RDI->elemsize,4);
      if (in_RDI->allocator == (Allocator *)0x0) {
        pvVar2 = ncnn::fastMalloc((size_t)in_RDI);
        in_RDI->data = pvVar2;
      }
      else {
        pvVar2 = (void *)(**(code **)(*(long *)in_RDI->allocator + 0x10))
                                   (in_RDI->allocator,sVar1 + 4);
        in_RDI->data = pvVar2;
      }
      in_RDI->refcount = (int *)((long)in_RDI->data + sVar1);
      *in_RDI->refcount = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 2 && w == _w && h == _h && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 2;
    w = _w;
    h = _h;
    c = 1;

    cstep = w * h;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}